

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O1

uint __thiscall
Saturation::PredicateSplitPassiveClauseContainer::bestQueue
          (PredicateSplitPassiveClauseContainer *this,float featureValue)

{
  pointer pfVar1;
  ulong uVar2;
  long lVar3;
  
  pfVar1 = (this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar3 == 0) {
    return 0;
  }
  uVar2 = 0;
  do {
    if (featureValue <= pfVar1[uVar2]) break;
    uVar2 = (ulong)((int)uVar2 + 1);
  } while (uVar2 < (ulong)(lVar3 >> 2));
  return (uint)uVar2;
}

Assistant:

unsigned PredicateSplitPassiveClauseContainer::bestQueue(float featureValue) const
{
  // compute best queue clause should be placed in
  ASS(_cutoffs.back() == std::numeric_limits<float>::max());
  for (unsigned i = 0; i < _cutoffs.size(); i++)
  {
    if (featureValue <= _cutoffs[i])
    {
      return i;
    }
  }
  // unreachable
  ASSERTION_VIOLATION;
}